

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_COMMENT(CodeGenGenericContext *ctx,char *text)

{
  char *text_local;
  CodeGenGenericContext *ctx_local;
  
  ctx->x86Op->name = o_other;
  (ctx->x86Op->field_4).comment = text;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_COMMENT(CodeGenGenericContext &ctx, const char* text)
{
#if !defined(NDEBUG)
	ctx.x86Op->name = o_other;
	ctx.x86Op->comment = text;
	ctx.x86Op++;
#else
	(void)ctx;
	(void)text;
#endif
}